

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *input)

{
  OutputFormat local_24;
  OutputFormat shellFormat;
  string *input_local;
  cmLinkLineComputer *this_local;
  
  local_24 = SHELL;
  if ((this->ForResponse & 1U) == 0) {
    if ((this->UseWatcomQuote & 1U) == 0) {
      if ((this->UseNinjaMulti & 1U) != 0) {
        local_24 = NINJAMULTI;
      }
    }
    else {
      local_24 = WATCOMQUOTE;
    }
  }
  else {
    local_24 = RESPONSE;
  }
  cmOutputConverter::ConvertToOutputForExisting
            (__return_storage_ptr__,this->OutputConverter,input,local_24);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToOutputForExisting(
  std::string const& input)
{
  cmOutputConverter::OutputFormat shellFormat = cmOutputConverter::SHELL;
  if (this->ForResponse) {
    shellFormat = cmOutputConverter::RESPONSE;
  } else if (this->UseWatcomQuote) {
    shellFormat = cmOutputConverter::WATCOMQUOTE;
  } else if (this->UseNinjaMulti) {
    shellFormat = cmOutputConverter::NINJAMULTI;
  }

  return this->OutputConverter->ConvertToOutputForExisting(input, shellFormat);
}